

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O2

void absl::lts_20250127::str_format_internal::anon_unknown_0::
     RoundUp<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1>
               (Buffer *buffer,int *exp)

{
  ushort *puVar1;
  char cVar2;
  char *pcVar3;
  
  pcVar3 = Buffer::back(buffer);
  do {
    if (pcVar3 < buffer->begin) {
      *pcVar3 = '1';
      buffer->begin = pcVar3;
      puVar1 = (ushort *)(pcVar3 + 1);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      *exp = *exp + 1;
      Buffer::pop_back(buffer);
      return;
    }
    cVar2 = *pcVar3;
    if (cVar2 != '.') {
      if (cVar2 != '9') {
        *pcVar3 = cVar2 + '\x01';
        return;
      }
      *pcVar3 = '0';
    }
    pcVar3 = pcVar3 + -1;
  } while( true );
}

Assistant:

void RoundUp(Buffer *buffer, int *exp) {
  char *p = &buffer->back();
  while (p >= buffer->begin && (*p == '9' || *p == '.')) {
    if (*p == '9') *p = '0';
    --p;
  }

  if (p < buffer->begin) {
    *p = '1';
    buffer->begin = p;
    if (mode == FormatStyle::Precision) {
      std::swap(p[1], p[2]);  // move the .
      ++*exp;
      buffer->pop_back();
    }
  } else {
    ++*p;
  }
}